

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DimensionTests.cpp
# Opt level: O3

void __thiscall DimensionTest_Values_Test::TestBody(DimensionTest_Values_Test *this)

{
  internal iVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  Message local_28;
  AssertHelper local_20;
  internal local_18 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  local_28.ss_.ptr_._0_4_ = 1;
  local_20.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<pica::Dimension,int>
            (local_18,"One","1",(Dimension *)&local_28,(int *)&local_20);
  iVar1 = local_18[0];
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message(&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/DimensionTests.cpp"
               ,9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (iVar1 != (internal)0x0) {
    local_28.ss_.ptr_._0_4_ = 2;
    local_20.data_._0_4_ = 2;
    testing::internal::CmpHelperEQ<pica::Dimension,int>
              (local_18,"Two","2",(Dimension *)&local_28,(int *)&local_20);
    iVar1 = local_18[0];
    if (local_18[0] == (internal)0x0) {
      testing::Message::Message(&local_28);
      if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/DimensionTests.cpp"
                 ,10,pcVar3);
      testing::internal::AssertHelper::operator=(&local_20,&local_28);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if (CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (iVar1 != (internal)0x0) {
      local_28.ss_.ptr_._0_4_ = 3;
      local_20.data_._0_4_ = 3;
      testing::internal::CmpHelperEQ<pica::Dimension,int>
                (local_18,"Three","3",(Dimension *)&local_28,(int *)&local_20);
      if (local_18[0] == (internal)0x0) {
        testing::Message::Message(&local_28);
        if (local_10.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_20,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/DimensionTests.cpp"
                   ,0xb,pcVar3);
        testing::internal::AssertHelper::operator=(&local_20,&local_28);
        testing::internal::AssertHelper::~AssertHelper(&local_20);
        if (CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

TEST(DimensionTest, Values) {
    ASSERT_EQ(One, 1);
    ASSERT_EQ(Two, 2);
    ASSERT_EQ(Three, 3);
}